

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_posix.c
# Opt level: O0

int thread_start(thread_handle *pt)

{
  int local_68;
  int local_64;
  int local_60;
  undefined1 local_58 [4];
  int ret;
  pthread_attr_t attr;
  thread_priv *priv;
  thread_handle *pt_local;
  
  attr._48_8_ = pt->priv;
  priv = (thread_priv *)pt;
  local_60 = pthread_attr_init((pthread_attr_t *)local_58);
  if (local_60 == 0) {
    if (((int)priv[1].thread == 0) ||
       (local_64 = pthread_attr_setstacksize((pthread_attr_t *)local_58,(ulong)(uint)priv[1].thread)
       , local_64 == 0)) {
      thread_join((thread_handle *)priv);
      mutex_lock((mutex_handle *)(attr._48_8_ + 8));
      local_68 = pthread_create((pthread_t *)attr._48_8_,(pthread_attr_t *)local_58,
                                (__start_routine *)(priv->mutex).priv,priv);
      *(byte *)(attr._48_8_ + 0x10) = (local_68 != 0 ^ 0xffU) & 1;
      mutex_unlock((mutex_handle *)(attr._48_8_ + 8));
      if (0 < local_68) {
        local_68 = -local_68;
      }
      pt_local._4_4_ = local_68;
    }
    else {
      if (0 < local_64) {
        local_64 = -local_64;
      }
      pt_local._4_4_ = local_64;
    }
  }
  else {
    if (0 < local_60) {
      local_60 = -local_60;
    }
    pt_local._4_4_ = local_60;
  }
  return pt_local._4_4_;
}

Assistant:

int thread_start(struct thread_handle *pt)
{
	struct thread_priv *priv = pt->priv;
	pthread_attr_t attr;
	int ret;

	ret = pthread_attr_init(&attr);
	if (ret != 0)
		return ret > 0 ? -ret : ret;

	if (pt->stack_size > 0) {
		ret = pthread_attr_setstacksize(&attr, pt->stack_size);
		if (ret != 0)
			return ret > 0 ? -ret : ret;
	}

	thread_join(pt);

	mutex_lock(&priv->mutex);

	ret = pthread_create(&priv->thread, &attr, pt->func_ptr, pt);

	priv->dirty = !(ret);

	mutex_unlock(&priv->mutex);

	return ret > 0 ? -ret : ret;
}